

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieanimation_capi.cpp
# Opt level: O0

LOTMarkerList * lottie_animation_get_markerlist(Lottie_Animation_S *animation)

{
  undefined1 auVar1 [16];
  size_type sVar2;
  void *__s;
  ulong __n;
  char *pcVar3;
  __tuple_element_t<1UL,_tuple<basic_string<char>,_int,_int>_> *p_Var4;
  __tuple_element_t<2UL,_tuple<basic_string<char>,_int,_int>_> *p_Var5;
  long in_RDI;
  size_t i;
  MarkerList markers;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  *in_stack_ffffffffffffffc0;
  ulong local_38;
  pointer in_stack_ffffffffffffffd8;
  pointer in_stack_ffffffffffffffe0;
  LOTMarkerList *local_8;
  
  if (in_RDI == 0) {
    local_8 = (LOTMarkerList *)0x0;
  }
  else {
    std::unique_ptr<rlottie::Animation,_std::default_delete<rlottie::Animation>_>::operator->
              ((unique_ptr<rlottie::Animation,_std::default_delete<rlottie::Animation>_> *)0x1aebe9)
    ;
    rlottie::Animation::markers_abi_cxx11_((Animation *)0x1aebf1);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
    ::vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
              *)in_stack_ffffffffffffffe0,
             (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
              *)in_stack_ffffffffffffffd8);
    sVar2 = std::
            vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
            ::size((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                    *)&stack0xffffffffffffffd8);
    if (sVar2 == 0) {
      local_8 = (LOTMarkerList *)0x0;
    }
    else if (*(long *)(in_RDI + 0x20) == 0) {
      __s = operator_new(0x10);
      memset(__s,0,0x10);
      *(void **)(in_RDI + 0x20) = __s;
      sVar2 = std::
              vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
              ::size((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                      *)&stack0xffffffffffffffd8);
      *(size_type *)(*(long *)(in_RDI + 0x20) + 8) = sVar2;
      sVar2 = std::
              vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
              ::size((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                      *)&stack0xffffffffffffffd8);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = sVar2;
      __n = SUB168(auVar1 * ZEXT816(0x18),0);
      if (SUB168(auVar1 * ZEXT816(0x18),8) != 0) {
        __n = 0xffffffffffffffff;
      }
      in_stack_ffffffffffffffc0 =
           (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
            *)operator_new__(__n);
      memset(in_stack_ffffffffffffffc0,0,__n);
      **(undefined8 **)(in_RDI + 0x20) = in_stack_ffffffffffffffc0;
      local_38 = 0;
      while( true ) {
        sVar2 = std::
                vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                ::size((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                        *)&stack0xffffffffffffffd8);
        if (sVar2 <= local_38) break;
        std::
        vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
        ::operator[]((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                      *)&stack0xffffffffffffffd8,local_38);
        std::get<0ul,std::__cxx11::string,int,int>
                  ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                    *)0x1aed29);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        pcVar3 = strdup(pcVar3);
        *(char **)(**(long **)(in_RDI + 0x20) + local_38 * 0x18) = pcVar3;
        std::
        vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
        ::operator[]((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                      *)&stack0xffffffffffffffd8,local_38);
        p_Var4 = std::get<1ul,std::__cxx11::string,int,int>
                           ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                             *)0x1aed6b);
        *(long *)(**(long **)(in_RDI + 0x20) + local_38 * 0x18 + 8) = (long)*p_Var4;
        std::
        vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
        ::operator[]((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                      *)&stack0xffffffffffffffd8,local_38);
        p_Var5 = std::get<2ul,std::__cxx11::string,int,int>
                           ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                             *)0x1aed9e);
        *(long *)(**(long **)(in_RDI + 0x20) + local_38 * 0x18 + 0x10) = (long)*p_Var5;
        local_38 = local_38 + 1;
      }
      local_8 = *(LOTMarkerList **)(in_RDI + 0x20);
    }
    else {
      local_8 = *(LOTMarkerList **)(in_RDI + 0x20);
    }
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
    ::~vector(in_stack_ffffffffffffffc0);
  }
  return local_8;
}

Assistant:

RLOTTIE_API const LOTMarkerList*
lottie_animation_get_markerlist(Lottie_Animation_S *animation)
{
   if (!animation) return nullptr;

   auto markers = animation->mAnimation->markers();
   if (markers.size() == 0) return nullptr;
   if (animation->mMarkerList) return (const LOTMarkerList*)animation->mMarkerList;

   animation->mMarkerList = new LOTMarkerList();
   animation->mMarkerList->size = markers.size();
   animation->mMarkerList->ptr = new LOTMarker[markers.size()]();

   for(size_t i = 0; i < markers.size(); i++) {
       animation->mMarkerList->ptr[i].name = strdup(std::get<0>(markers[i]).c_str());
       animation->mMarkerList->ptr[i].startframe= std::get<1>(markers[i]);
       animation->mMarkerList->ptr[i].endframe= std::get<2>(markers[i]);
   }
   return (const LOTMarkerList*)animation->mMarkerList;
}